

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

uint64_t scale_counts(vector<unsigned_int,_std::allocator<unsigned_int>_> *F,size_t maxv,int silent)

{
  uint uVar1;
  double dVar2;
  value_type vVar3;
  int iVar4;
  reference pvVar5;
  ulong in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar6;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  int i;
  uint64_t total;
  size_t maxsym;
  double ratio;
  size_t power;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 auVar8 [64];
  
  local_38 = 0;
  for (local_3c = 1; (ulong)(long)local_3c <= in_RSI; local_3c = local_3c + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(long)local_3c);
    *pvVar5 = *pvVar5 - 1;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(long)local_3c);
    local_38 = (ulong)*pvVar5 + local_38;
  }
  auVar7 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,local_38);
  dVar6 = 2147483648.0 / auVar7._0_8_;
  auVar8 = ZEXT1664(CONCAT88(in_XMM0_Qb,dVar6));
  local_30 = 1;
  iVar4 = 0;
  for (local_3c = 1; auVar7 = auVar8._0_16_, (ulong)(long)local_3c <= in_RSI;
      local_3c = local_3c + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(long)local_3c);
    auVar7 = vcvtusi2sd_avx512f(auVar7,*pvVar5);
    dVar2 = auVar7._0_8_ * dVar6;
    auVar8 = ZEXT864((ulong)dVar2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar2;
    vVar3 = vcvttsd2usi_avx512f(auVar7);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(long)local_3c);
    *pvVar5 = vVar3;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(long)local_3c);
    iVar4 = *pvVar5 + iVar4;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(long)local_3c);
    uVar1 = *pvVar5;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_30);
    if (*pvVar5 < uVar1) {
      local_30 = (size_type)local_3c;
    }
  }
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_30);
  *pvVar5 = *pvVar5 + (-0x80000000 - iVar4);
  return 0x80000000;
}

Assistant:

uint64_t scale_counts(std::vector<uint32_t>& F, size_t maxv, int silent)
{
    size_t power;
    double ratio;
    size_t maxsym;
    uint64_t total;
    int i;
    power = TBTS;
    total = 0;
    for (i = 1; i <= maxv; i++) {
        /* shift from 1-origin back to 0-origin */
        F[i]--;
        total += F[i];
    }
    ratio = ((double)(1LL << power)) / total;

    /* do the adjustment, tracking the new total and also locating the
       most probable symbol */
    maxsym = 1;
    total = 0;
    for (i = 1; i <= maxv; i++) {
        /* these are still offset by 1 after the interp step */
        F[i] = F[i] * ratio;
        total += F[i];
        if (F[i] > F[maxsym]) {
            maxsym = i;
        }
    }
    /* allocate the leftover remainder as a bonus to the MFS */
    F[maxsym] += (1LL << power) - total;
    return (1LL << power);
}